

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O2

bool imageHasNarrowOutlines(QImage *im)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QRgb QVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int x;
  int iVar8;
  int local_34;
  
  bVar1 = QImage::isNull(im);
  if (((bVar1) || (iVar2 = QImage::width(im), iVar2 < 1)) || (iVar2 = QImage::height(im), iVar2 < 1)
     ) {
    return false;
  }
  iVar2 = QImage::width(im);
  if (iVar2 == 1) {
    return true;
  }
  iVar2 = QImage::height(im);
  if (iVar2 == 1) {
    return true;
  }
  iVar2 = QImage::height(im);
  iVar7 = 0;
  local_34 = 999;
  uVar5 = 0;
  for (iVar8 = 0; iVar3 = QImage::width(im), iVar8 < iVar3; iVar8 = iVar8 + 1) {
    QVar4 = QImage::pixel(im,iVar8,(iVar2 + 1) / 2);
    if ((int)QVar4 < 0) {
      iVar7 = iVar7 + 1;
    }
    else if (uVar5 != 0) {
      if (iVar7 <= local_34) {
        local_34 = iVar7;
      }
      iVar7 = 0;
    }
    uVar5 = QVar4 >> 0x1f;
  }
  iVar7 = QImage::width(im);
  iVar8 = 0;
  iVar2 = 999;
  uVar5 = 0;
  for (iVar3 = 0; iVar6 = QImage::height(im), iVar3 < iVar6; iVar3 = iVar3 + 1) {
    QVar4 = QImage::pixel(im,(iVar7 + 1) / 2,iVar3);
    if ((int)QVar4 < 0) {
      iVar8 = iVar8 + 1;
    }
    else if (uVar5 != 0) {
      if (iVar8 <= iVar2) {
        iVar2 = iVar8;
      }
      iVar8 = 0;
    }
    uVar5 = QVar4 >> 0x1f;
  }
  return iVar2 == 1 || local_34 == 1;
}

Assistant:

static bool imageHasNarrowOutlines(const QImage &im)
{
    if (im.isNull() || im.width() < 1 || im.height() < 1)
        return false;
    else if (im.width() == 1 || im.height() == 1)
        return true;

    int minHThick = 999;
    int minVThick = 999;

    int thick = 0;
    bool in = false;
    int y = (im.height() + 1) / 2;
    for (int x = 0; x < im.width(); ++x) {
        int a = qAlpha(im.pixel(x, y));
        if (a > 127) {
            in = true;
            ++thick;
        } else if (in) {
            in = false;
            minHThick = qMin(minHThick, thick);
            thick = 0;
        }
    }

    thick = 0;
    in = false;
    int x = (im.width() + 1) / 2;
    for (int y = 0; y < im.height(); ++y) {
        int a = qAlpha(im.pixel(x, y));
        if (a > 127) {
            in = true;
            ++thick;
        } else if (in) {
            in = false;
            minVThick = qMin(minVThick, thick);
            thick = 0;
        }
    }

    return minHThick == 1 || minVThick == 1;
}